

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_integrand_quad_err2(void *void_node_area,REF_DBL *bary,REF_DBL *error)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  REF_DBL shape [27];
  REF_DBL local_f8 [27];
  
  uVar1 = ref_cell_shape(REF_CELL_TR3,bary,local_f8);
  if (uVar1 == 0) {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + local_f8[lVar2] * *(double *)((long)void_node_area + lVar2 * 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    dVar4 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = dVar4 + bary[lVar2] * *(double *)((long)void_node_area + lVar2 * 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    dVar3 = dVar3 - dVar4;
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    *error = dVar3 * *(double *)((long)void_node_area + 0x30);
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe84,
           "ref_metric_integrand_quad_err2",(ulong)uVar1,"shape");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_integrand_quad_err2(void *void_node_area,
                                                         REF_DBL *bary,
                                                         REF_DBL *error) {
  REF_DBL *node_area = (REF_DBL *)void_node_area;
  REF_DBL shape[REF_CELL_MAX_SIZE_PER];
  REF_INT i;
  REF_DBL quadratic, linear;
  REF_INT p = 1;

  RSS(ref_cell_shape(REF_CELL_TR3, bary, shape), "shape");

  quadratic = 0.0;
  for (i = 0; i < 6; i++) {
    quadratic += shape[i] * node_area[i];
  }
  linear = 0.0;
  for (i = 0; i < 3; i++) {
    linear += bary[i] * node_area[i];
  }
  *error = pow(ABS(quadratic - linear), p) * node_area[6];
  return REF_SUCCESS;
}